

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::
HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
::Insert(HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
         *this,LightHandle *key,unsigned_long *value)

{
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar1;
  anon_struct_8_0_00000001_for___align aVar2;
  unsigned_long uVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar4 = FindOffset(this,key);
  if (((this->table).ptr[sVar4].set == false) &&
     (sVar5 = this->nStored + 1, this->nStored = sVar5, (this->table).nStored < sVar5 * 3)) {
    Grow(this);
    sVar4 = FindOffset(this,key);
  }
  aVar2 = (anon_struct_8_0_00000001_for___align)
          (key->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  uVar3 = *value;
  poVar1 = (this->table).ptr + sVar4;
  if (poVar1->set == true) {
    poVar1->set = false;
  }
  (poVar1->optionalValue).__align = aVar2;
  *(unsigned_long *)((long)&poVar1->optionalValue + 8) = uVar3;
  poVar1->set = true;
  return;
}

Assistant:

void Insert(const Key &key, const Value &value) {
        size_t offset = FindOffset(key);
        if (table[offset].has_value() == false) {
            // Grow hash table if it is too full
            if (3 * ++nStored > capacity()) {
                Grow();
                offset = FindOffset(key);
            }
        }
        table[offset] = std::make_pair(key, value);
    }